

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O3

bool fs_is_reserved(string_view path)

{
  long *plVar1;
  _Bool _Var2;
  int iVar3;
  long lVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  bool bVar6;
  string n;
  string s;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_30UL> r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  long *local_218;
  long local_210;
  long local_208 [2];
  undefined1 local_1f8 [24];
  string_view in_stack_fffffffffffffe20;
  string_view in_stack_fffffffffffffe60;
  
  _Var2 = fs_is_windows();
  if (_Var2) {
    fs_file_name_abi_cxx11_(in_stack_fffffffffffffe20);
    if ((local_238._M_string_length == 0) ||
       (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_238,"."), iVar3 == 0)) {
      bVar6 = false;
    }
    else {
      bVar6 = true;
      if (((local_238._M_dataplus._M_p[local_238._M_string_length - 1] != ' ') &&
          (local_238._M_dataplus._M_p[local_238._M_string_length - 1] != '.')) &&
         (lVar4 = std::__cxx11::string::find_first_of((char *)&local_238,0x11ae6d,0), lVar4 == -1))
      {
        fs_stem_abi_cxx11_(in_stack_fffffffffffffe60);
        plVar1 = local_218;
        if (local_210 - 3U < 2) {
          lVar4 = 0;
          do {
            iVar3 = toupper((int)*(char *)((long)plVar1 + lVar4));
            *(char *)((long)plVar1 + lVar4) = (char)iVar3;
            lVar4 = lVar4 + 1;
          } while (local_210 != lVar4);
          memcpy(local_1f8,&DAT_00124b68,0x1e0);
          pbVar5 = std::
                   __find_if<std::basic_string_view<char,std::char_traits<char>>const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (local_1f8,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              &stack0xffffffffffffffe8,&local_218);
          bVar6 = pbVar5 != (basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xffffffffffffffe8;
        }
        else {
          bVar6 = false;
        }
        if (local_218 != local_208) {
          operator_delete(local_218,local_208[0] + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    return bVar6;
  }
  return false;
}

Assistant:

bool
fs_is_reserved(std::string_view path)
{
  // defined as https://docs.python.org/3.13/library/os.path.html#os.path.isreserved
  if(!fs_is_windows())
    return false;

  std::string const n = fs_file_name(path);

  if(n.empty() || n == ".")
    return false;

  if(n.back() == '.' || n.back() == ' ')
    return true;

  // return true if filename contains any of :*?"<>| or ends with a space or period
  // https://docs.microsoft.com/en-us/windows/win32/fileio/naming-a-file

  if(n.find_first_of(R"(<>:"/\|?*)") != std::string::npos)
    return true;

  // don't detect ASCII control characters as reserved, since multi-byte characters may falsely trip that check

  std::string s = fs_stem(n);

  if(std::string::size_type L = s.length();
      L < 3 || L > 4)
    return false;

  // convert to upper case
  std::transform(s.begin(), s.end(), s.begin(), ::toupper);

// check if the stem is a reserved device name
  constexpr std::array<std::string_view, 30> r = {"CON", "PRN", "AUX", "NUL",
    "COM1", "COM2", "COM3", "COM4", "COM5", "COM6", "COM7", "COM8", "COM9", "COM¹", "COM²", "COM³",
    "LPT1", "LPT2", "LPT3", "LPT4", "LPT5", "LPT6", "LPT7", "LPT8", "LPT9", "LPT¹", "LPT²", "LPT³",
    "CONIN$", "CONOUT$"};

#ifdef __cpp_lib_ranges_contains  // C++23
  if (std::ranges::contains(r, s))
#elif defined(__cpp_lib_ranges) // C++20
  if (std::ranges::find(r, s) != r.end())
#else // C++98
  if (std::find(r.begin(), r.end(), s) != r.end())
#endif
    return true;

return false;
}